

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTPrinter.cc
# Opt level: O0

int __thiscall
flow::lang::ASTPrinter::accept(ASTPrinter *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  bool bVar1;
  int extraout_EAX;
  char *args;
  SymbolTable *this_00;
  reference this_01;
  pointer pSVar2;
  undefined4 in_register_00000034;
  unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_> *symbol;
  iterator __end2;
  iterator __begin2;
  SymbolTable *__range2;
  UnitSym *unit_local;
  ASTPrinter *this_local;
  
  Symbol::name_abi_cxx11_((Symbol *)CONCAT44(in_register_00000034,__fd));
  args = (char *)std::__cxx11::string::c_str();
  printf<char_const*>(this,"Unit: %s\n",args);
  enter(this);
  this_00 = ScopedSym::scope((ScopedSym *)CONCAT44(in_register_00000034,__fd));
  __end2 = SymbolTable::begin(this_00);
  symbol = (unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_> *)
           SymbolTable::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>_*,_std::vector<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>,_std::allocator<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>_>_>_>
                                *)&symbol);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>_*,_std::vector<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>,_std::allocator<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>_>_>_>
              ::operator*(&__end2);
    pSVar2 = std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>::
             operator->(this_01);
    (*(pSVar2->super_ASTNode)._vptr_ASTNode[2])(pSVar2,this);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>_*,_std::vector<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>,_std::allocator<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>_>_>_>
    ::operator++(&__end2);
  }
  leave(this);
  return extraout_EAX;
}

Assistant:

void ASTPrinter::accept(UnitSym& unit) {
  printf("Unit: %s\n", unit.name().c_str());

  enter();
  for (std::unique_ptr<Symbol>& symbol : *unit.scope())
    symbol->visit(*this);

  leave();
}